

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O0

FSkillInfo * __thiscall FSkillInfo::operator=(FSkillInfo *this,FSkillInfo *other)

{
  FSkillInfo *other_local;
  FSkillInfo *this_local;
  
  FName::operator=(&this->Name,&other->Name);
  this->AmmoFactor = other->AmmoFactor;
  this->DoubleAmmoFactor = other->DoubleAmmoFactor;
  this->DropAmmoFactor = other->DropAmmoFactor;
  this->DamageFactor = other->DamageFactor;
  this->FastMonsters = (bool)(other->FastMonsters & 1);
  this->SlowMonsters = (bool)(other->SlowMonsters & 1);
  this->DisableCheats = (bool)(other->DisableCheats & 1);
  this->AutoUseHealth = (bool)(other->AutoUseHealth & 1);
  this->EasyBossBrain = (bool)(other->EasyBossBrain & 1);
  this->EasyKey = (bool)(other->EasyKey & 1);
  this->RespawnCounter = other->RespawnCounter;
  this->RespawnLimit = other->RespawnLimit;
  this->Aggressiveness = other->Aggressiveness;
  this->SpawnFilter = other->SpawnFilter;
  this->ACSReturn = other->ACSReturn;
  FString::operator=(&this->MenuName,&other->MenuName);
  FString::operator=(&this->PicName,&other->PicName);
  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::operator=
            (&this->MenuNamesForPlayerClass,&other->MenuNamesForPlayerClass);
  this->MustConfirm = (bool)(other->MustConfirm & 1);
  FString::operator=(&this->MustConfirmText,&other->MustConfirmText);
  this->Shortcut = other->Shortcut;
  FString::operator=(&this->TextColor,&other->TextColor);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::operator=
            (&this->Replace,&other->Replace);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::operator=
            (&this->Replaced,&other->Replaced);
  this->MonsterHealth = other->MonsterHealth;
  this->FriendlyHealth = other->FriendlyHealth;
  this->NoPain = (bool)(other->NoPain & 1);
  this->Infighting = other->Infighting;
  this->ArmorFactor = other->ArmorFactor;
  this->HealthFactor = other->HealthFactor;
  return this;
}

Assistant:

FSkillInfo &FSkillInfo::operator=(const FSkillInfo &other)
{
	Name = other.Name;
	AmmoFactor = other.AmmoFactor;
	DoubleAmmoFactor = other.DoubleAmmoFactor;
	DropAmmoFactor = other.DropAmmoFactor;
	DamageFactor = other.DamageFactor;
	FastMonsters = other.FastMonsters;
	SlowMonsters = other.SlowMonsters;
	DisableCheats = other.DisableCheats;
	AutoUseHealth = other.AutoUseHealth;
	EasyBossBrain = other.EasyBossBrain;
	EasyKey = other.EasyKey;
	RespawnCounter= other.RespawnCounter;
	RespawnLimit= other.RespawnLimit;
	Aggressiveness= other.Aggressiveness;
	SpawnFilter = other.SpawnFilter;
	ACSReturn = other.ACSReturn;
	MenuName = other.MenuName;
	PicName = other.PicName;
	MenuNamesForPlayerClass = other.MenuNamesForPlayerClass;
	MustConfirm = other.MustConfirm;
	MustConfirmText = other.MustConfirmText;
	Shortcut = other.Shortcut;
	TextColor = other.TextColor;
	Replace = other.Replace;
	Replaced = other.Replaced;
	MonsterHealth = other.MonsterHealth;
	FriendlyHealth = other.FriendlyHealth;
	NoPain = other.NoPain;
	Infighting = other.Infighting;
	ArmorFactor = other.ArmorFactor;
	HealthFactor = other.HealthFactor;
	return *this;
}